

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  string *psVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_003fca7f;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) != 9) {
        MutableString_abi_cxx11_();
      }
      psVar2 = (string *)(pEVar1->field_0).int64_t_value;
      goto LAB_003fca65;
    }
LAB_003fca93:
    MutableString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_003fca9d:
    psVar2 = (string *)operator_new(0x20);
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      MutableString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_003fca7f:
      MutableString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_003fca89:
      MutableString_abi_cxx11_();
      goto LAB_003fca93;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) goto LAB_003fca89;
    pEVar1->is_repeated = false;
    pEVar1->field_0xa = pEVar1->field_0xa | 1;
    if (&this->arena_->impl_ == (ThreadSafeArena *)0x0) goto LAB_003fca9d;
    psVar2 = (string *)ThreadSafeArena::AllocateFromStringBlock(&this->arena_->impl_);
  }
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  psVar2->_M_string_length = 0;
  (psVar2->field_2)._M_local_buf[0] = '\0';
  (pEVar1->field_0).int64_t_value = (int64_t)psVar2;
LAB_003fca65:
  pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
  return psVar2;
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->ptr.string_value = Arena::Create<std::string>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->ptr.string_value;
}